

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpListener.cpp
# Opt level: O1

int __thiscall
TcpListener::accept(TcpListener *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  int fd;
  long *plVar1;
  undefined1 auStack_38 [8];
  sockaddr_in addr;
  socklen_t local_1c [2];
  socklen_t l;
  
  auStack_38._0_2_ = 0;
  auStack_38[2] = '\0';
  auStack_38[3] = '\0';
  auStack_38[4] = '\0';
  auStack_38[5] = '\0';
  auStack_38[6] = '\0';
  auStack_38[7] = '\0';
  addr.sin_family = 0;
  addr.sin_port = 0;
  addr.sin_addr.s_addr = 0;
  local_1c[0] = 0x10;
  fd = ::accept((this->m_socket).super_Socket._fd,(sockaddr *)auStack_38,local_1c);
  if (fd < 0) {
    plVar1 = (long *)0x0;
  }
  else {
    plVar1 = (long *)operator_new(0x50);
    plVar1[1] = 0;
    plVar1[3] = 0;
    plVar1[4] = 0;
    plVar1[5] = 0;
    plVar1[6] = 0;
    plVar1[7] = 0;
    *plVar1 = (long)&PTR__TcpConn_00108d00;
    plVar1[2] = (long)&DAT_00108d68;
    TcpSocket::TcpSocket((TcpSocket *)(plVar1 + 8),fd);
    (**(code **)(*plVar1 + 0x30))(plVar1);
  }
  return (int)plVar1;
}

Assistant:

TcpConn *TcpListener::accept()
{
    struct sockaddr_in addr = {0};
    socklen_t l = sizeof(addr);
    socket_t sock = ::accept(m_socket.GetFd(), (struct sockaddr *)&addr, &l);
    if (sock < 0)
    {
        return nullptr;
    }
    TcpConn *tc = new TcpConn(sock);
    tc->Init();
    //ts->makeKeepAlive(30, 5, 3);
    return tc;
}